

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

int64_t secp256k1_modinv64_divsteps_59
                  (int64_t zeta,uint64_t f0,uint64_t g0,secp256k1_modinv64_trans2x2 *t)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int local_8c;
  int i;
  uint64_t z;
  uint64_t y;
  uint64_t x;
  uint64_t g;
  uint64_t f;
  uint64_t mask2;
  uint64_t mask1;
  uint64_t c2;
  uint64_t c1;
  uint64_t r;
  uint64_t q;
  uint64_t v;
  uint64_t u;
  secp256k1_modinv64_trans2x2 *t_local;
  uint64_t g0_local;
  
  q = 8;
  r = 0;
  c1 = 0;
  c2 = 8;
  y = g0;
  x = f0;
  g0_local = zeta;
  for (local_8c = 3; local_8c < 0x3e; local_8c = local_8c + 1) {
    uVar1 = (long)g0_local >> 0x3f;
    uVar3 = -(y & 1);
    uVar2 = ((x ^ uVar1) - uVar1 & uVar3) + y;
    c1 = ((q ^ uVar1) - uVar1 & uVar3) + c1;
    c2 = ((r ^ uVar1) - uVar1 & uVar3) + c2;
    uVar3 = uVar3 & uVar1;
    g0_local = (g0_local ^ uVar3) - 1;
    x = (uVar2 & uVar3) + x;
    y = uVar2 >> 1;
    q = ((c1 & uVar3) + q) * 2;
    r = ((c2 & uVar3) + r) * 2;
  }
  t->u = q;
  t->v = r;
  t->q = c1;
  t->r = c2;
  return g0_local;
}

Assistant:

static int64_t secp256k1_modinv64_divsteps_59(int64_t zeta, uint64_t f0, uint64_t g0, secp256k1_modinv64_trans2x2 *t) {
    /* u,v,q,r are the elements of the transformation matrix being built up,
     * starting with the identity matrix times 8 (because the caller expects
     * a result scaled by 2^62). Semantically they are signed integers
     * in range [-2^62,2^62], but here represented as unsigned mod 2^64. This
     * permits left shifting (which is UB for negative numbers). The range
     * being inside [-2^63,2^63) means that casting to signed works correctly.
     */
    uint64_t u = 8, v = 0, q = 0, r = 8;
    volatile uint64_t c1, c2;
    uint64_t mask1, mask2, f = f0, g = g0, x, y, z;
    int i;

    for (i = 3; i < 62; ++i) {
        VERIFY_CHECK((f & 1) == 1); /* f must always be odd */
        VERIFY_CHECK((u * f0 + v * g0) == f << i);
        VERIFY_CHECK((q * f0 + r * g0) == g << i);
        /* Compute conditional masks for (zeta < 0) and for (g & 1). */
        c1 = zeta >> 63;
        mask1 = c1;
        c2 = g & 1;
        mask2 = -c2;
        /* Compute x,y,z, conditionally negated versions of f,u,v. */
        x = (f ^ mask1) - mask1;
        y = (u ^ mask1) - mask1;
        z = (v ^ mask1) - mask1;
        /* Conditionally add x,y,z to g,q,r. */
        g += x & mask2;
        q += y & mask2;
        r += z & mask2;
        /* In what follows, c1 is a condition mask for (zeta < 0) and (g & 1). */
        mask1 &= mask2;
        /* Conditionally change zeta into -zeta-2 or zeta-1. */
        zeta = (zeta ^ mask1) - 1;
        /* Conditionally add g,q,r to f,u,v. */
        f += g & mask1;
        u += q & mask1;
        v += r & mask1;
        /* Shifts */
        g >>= 1;
        u <<= 1;
        v <<= 1;
        /* Bounds on zeta that follow from the bounds on iteration count (max 10*59 divsteps). */
        VERIFY_CHECK(zeta >= -591 && zeta <= 591);
    }
    /* Return data in t and return value. */
    t->u = (int64_t)u;
    t->v = (int64_t)v;
    t->q = (int64_t)q;
    t->r = (int64_t)r;

    /* The determinant of t must be a power of two. This guarantees that multiplication with t
     * does not change the gcd of f and g, apart from adding a power-of-2 factor to it (which
     * will be divided out again). As each divstep's individual matrix has determinant 2, the
     * aggregate of 59 of them will have determinant 2^59. Multiplying with the initial
     * 8*identity (which has determinant 2^6) means the overall outputs has determinant
     * 2^65. */
    VERIFY_CHECK(secp256k1_modinv64_det_check_pow2(t, 65, 0));

    return zeta;
}